

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O1

int __thiscall
VC1StreamReader::getNextBFrames(VC1StreamReader *this,uint8_t *buffer,int64_t *bTiming)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint8_t *end;
  long lVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  char cVar8;
  bool bVar9;
  VC1Frame frame;
  uint local_84;
  VC1Frame local_78;
  
  *bTiming = 0;
  pbVar7 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  for (pbVar6 = buffer + 2; pbVar6 < pbVar7; pbVar6 = pbVar6 + lVar3) {
    lVar3 = 3;
    if (*pbVar6 < 2) {
      if (*pbVar6 == 0) {
        lVar3 = 1;
      }
      else if ((pbVar6[-2] == 0) && (pbVar6[-1] == 0)) {
        pbVar7 = pbVar6 + -2;
        break;
      }
    }
  }
  end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  if (pbVar7 < end + -4) {
    uVar5 = 0;
    do {
      if ((pbVar7[3] & 0xef) == 0xd) {
        local_78.super_VC1Unit.bitReader.super_BitStream.m_totalBits = 0;
        local_78.tff = 0;
        local_78.rff = 0;
        local_78.rptfrmBitPos = 0;
        local_78.super_VC1Unit.m_nalBufferLen = 0;
        local_78.fcm = 0;
        local_78.pict_type = I_TYPE;
        local_78.super_VC1Unit.bitReader.m_curVal = 0;
        local_78.super_VC1Unit.bitReader.m_bitLeft = 0;
        local_78.super_VC1Unit.m_nalBuffer = (uint8_t *)0x0;
        local_78.super_VC1Unit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
        local_78.super_VC1Unit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
        local_78.rptfrm = 0;
        iVar1 = VC1Frame::decode_frame_direct(&local_78,&this->m_sequence,pbVar7 + 4,end);
        cVar8 = '\x02';
        uVar2 = local_84;
        if (iVar1 == 0) {
          cVar8 = '\x01';
          uVar2 = uVar5;
          if (P_TYPE < local_78.pict_type) {
            lVar3 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
            if ((this->m_sequence).pulldown != 0) {
              if (((this->m_sequence).interlace == true) && ((this->m_sequence).psf == 0)) {
                if (local_78.rff == 0) {
                  lVar4 = 0;
                }
                else {
                  lVar4 = (this->super_MPEGStreamReader).m_pcrIncPerField;
                }
                lVar3 = lVar3 + lVar4;
              }
              else {
                lVar3 = lVar3 * ((ulong)local_78.rptfrm + 1);
              }
            }
            *bTiming = *bTiming + lVar3;
            uVar5 = uVar5 + 1;
            cVar8 = uVar5 == (this->m_sequence).max_b_frames;
            uVar2 = local_84;
            if ((bool)cVar8) {
              uVar2 = uVar5;
            }
          }
        }
        local_84 = uVar2;
        if (local_78.super_VC1Unit.m_nalBuffer != (uint8_t *)0x0) {
          operator_delete__(local_78.super_VC1Unit.m_nalBuffer);
        }
      }
      else {
        cVar8 = '\0';
      }
      if (cVar8 != '\0') goto LAB_001ec6ac;
      pbVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      for (pbVar7 = pbVar7 + 6; pbVar7 < pbVar6; pbVar7 = pbVar7 + lVar3) {
        lVar3 = 3;
        if (*pbVar7 < 2) {
          if (*pbVar7 == 0) {
            lVar3 = 1;
          }
          else if ((pbVar7[-2] == 0) && (pbVar7[-1] == 0)) {
            pbVar6 = pbVar7 + -2;
            break;
          }
        }
      }
      end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      pbVar7 = pbVar6;
    } while (pbVar6 < end + -4);
    cVar8 = '\x02';
LAB_001ec6ac:
    bVar9 = cVar8 == '\x02';
    bTiming = (int64_t *)(ulong)local_84;
  }
  else {
    uVar5 = 0;
    bVar9 = true;
  }
  uVar2 = 0xffffffff;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    uVar2 = uVar5;
  }
  if (!bVar9) {
    uVar2 = (uint)bTiming;
  }
  return uVar2;
}

Assistant:

int VC1StreamReader::getNextBFrames(uint8_t* buffer, int64_t& bTiming) const
{
    int bFrameCnt = 0;
    bTiming = 0;
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code == VC1Code::FRAME || vc1Code == VC1Code::USER_FRAME)
        {
            VC1Frame frame;
            if (frame.decode_frame_direct(m_sequence, nal + 4, m_bufEnd) != 0)
                break;
            if (frame.pict_type == VC1PictType::I_TYPE || frame.pict_type == VC1PictType::P_TYPE)
                return bFrameCnt;
            bFrameCnt++;

            int64_t pcrIncVal = m_pcrIncPerFrame;

            if (m_sequence.pulldown)
            {
                if (!m_sequence.interlace || m_sequence.psf)
                {
                    pcrIncVal = pcrIncVal * (static_cast<int64_t>(frame.rptfrm) + 1);
                }
                else
                {
                    pcrIncVal += (frame.rff ? m_pcrIncPerField : 0);
                }
            }
            bTiming += pcrIncVal;

            if (bFrameCnt == m_sequence.max_b_frames)
                return bFrameCnt;
        }
    }
    if (m_eof)
    {
        return bFrameCnt;
    }
    return -1;
}